

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  dns_param *addr;
  i2cp_state *st;
  i2cp_param *host;
  _Bool _Var1;
  uint uVar2;
  long lVar3;
  char *filename;
  int iVar4;
  trans2p *ptVar5;
  undefined8 *puVar6;
  byte bVar7;
  tun_param in_stack_ffffffffff8ab068;
  trans2p t;
  
  bVar7 = 0;
  if (argc < 2) {
    filename = "default.ini";
  }
  else {
    filename = argv[1];
  }
  memset(&stack0xffffffffff8ac1b0,0,0x800);
  memset(&stack0xffffffffff8ab998,0,0x810);
  memset(&stack0xffffffffff8ab180,0,0x810);
  config_init_default(&t.config);
  uVar2 = ini_parse(filename,iter_config,&t);
  if (uVar2 == 0xfffffffe) {
    puts("alloc error");
    iVar4 = -2;
  }
  else {
    if (uVar2 == 0) {
      t.dns.ev.flags = 1;
      t.dns.ev.ptr = &stack0xffffffffff8ab178;
      t.dns.ev.fd = udp_socket();
      if (t.dns.ev.fd == -1) {
        __assert_fail("t.dns.ev.fd != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                      ,0x1a2,"int main(int, char **)");
      }
      addr = &t.config.dns;
      printf("binding dns server to %s:%d\n",addr,(ulong)(uint)t.config.dns.port);
      _Var1 = udp_bind(t.dns.ev.fd,addr->addr,t.config.dns.port);
      if (_Var1) {
        dns_state_init(&t.dns);
        addr_mapper_init(&t.dns.addr,&t.config.tun.addr,&t.config.tun.netmask);
        i2p_crypto_init();
        st = &t.i2cp;
        i2cp_state_init(st,i2cp_write,&t);
        i2cp_set_msghandler(st,'!',onsetdate,&t);
        i2cp_set_msghandler(st,'\x14',onsessionstatus,&t);
        i2cp_set_msghandler(st,'%',onreqvarls,&t);
        i2cp_set_msghandler(st,'\x1f',onpayload,&t);
        _Var1 = ev_init(&t.api);
        if (!_Var1) {
          __assert_fail("ev_init(&t.api)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                        ,0x1b6,"int main(int, char **)");
        }
        t.running = true;
        t.impl = (*t.api.open)();
        if (t.impl != (ev_impl *)0x0) {
          (*t.api.add)(t.impl,&t.dns.ev);
          if (t.config.tun.enabled == true) {
            printf("open tun interface %s\n",&t);
            ptVar5 = &t;
            puVar6 = (undefined8 *)&stack0xffffffffff8ab068;
            for (lVar3 = 0x22; lVar3 != 0; lVar3 = lVar3 + -1) {
              *puVar6 = *(undefined8 *)(ptVar5->config).tun.ifname;
              ptVar5 = (trans2p *)((long)ptVar5 + (ulong)bVar7 * -0x10 + 8);
              puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
            }
            t.tun.ev.fd = (*t.api.tun)(t.impl,in_stack_ffffffffff8ab068);
            if (t.tun.ev.fd == -1) {
              printf("failed to open %s\n",&t);
              return 1;
            }
            t.tun.ev.ptr = &stack0xffffffffff8ac1a8;
            t.tun.ev.flags = 3;
            t.tun.read.sz = 0;
            t.tun.read.idx = 0;
            t.tun.write.sz = 0;
            t.tun.write.idx = 0;
            (*t.api.add)(t.impl,&t.tun.ev);
          }
          else {
            puts("tun interface disabled");
          }
          while( true ) {
            while( true ) {
              while( true ) {
                if (t.running != true) {
                  (*t.api.close)(t.impl);
                  i2p_crypto_end();
                  return 0;
                }
                puts("generate new identity");
                i2p_keygen(&t.privkey);
                i2p_privkey_dest(&t.privkey,&t.ourdest);
                i2p_dest_tob32addr(&t.ourdest,(char *)t.buf,0x10000);
                printf("we are %s\n",t.buf);
                if (t.config.i2cp.enabled == true) break;
                mainloop(&t);
              }
              host = &t.config.i2cp;
              printf("connecting to i2p router at %s port %d\n",host,(ulong)(uint)t.config.i2cp.port
                    );
              _Var1 = blocking_tcp_connect(host->addr,t.config.i2cp.port,&t.i2cp_fd);
              if (_Var1) break;
              perror("blocking_tcp_connect()");
              sleep(1);
            }
            t.i2cp_ev.fd = t.i2cp_fd;
            t.i2cp_ev.ptr = &stack0xffffffffff8ab990;
            t.i2cp_ev.flags = 1;
            _Var1 = (*t.api.add)(t.impl,&t.i2cp_ev);
            if (!_Var1) break;
            i2cp_begin(&t.i2cp);
            mainloop(&t);
            (*t.api.del)(t.impl,t.i2cp_fd);
          }
          __assert_fail("api->add(t.impl, &t.i2cp_ev)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                        ,0x1dd,"int main(int, char **)");
        }
        __assert_fail("t.impl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                      ,0x1ba,"int main(int, char **)");
      }
      printf("failed to bind udp socket for dns at %s %d\n",addr,(ulong)(uint)t.config.dns.port);
    }
    else {
      if (uVar2 != 0xffffffff) {
        printf("error %d\n",(ulong)uVar2);
        return uVar2;
      }
      printf("cannot open %s\n",filename);
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char * argv[])
{
  const char * fname = "default.ini";


  if(argc > 1)
    fname = argv[1];
  
  struct trans2p t;

  struct handler tun_handler = {
    .t = &t,
    .read = &tun_onpacket,
    .write = &tun_flushwrite
  };
  
  struct handler i2cp_handler = {
    .t = &t,
    .read = &i2cp_onread,
    .write = NULL
  };

  struct handler dns_handler = {
    .t = &t,
    .read = &dns_onread,
    .write = NULL
  };
  
  config_init_default(&t.config);

  int err = ini_parse(fname, &iter_config, &t.config);
  if (err != 0)
  {
    if(err == -1)
      printf("cannot open %s\n", fname);
    else if(err == -2)
      printf("alloc error\n");
    else
      printf("error %d\n", err);
    return err;
  }

  t.dns.ev.flags = EV_READ;
  t.dns.ev.ptr = &dns_handler;
  t.dns.ev.fd = udp_socket();
  assert(t.dns.ev.fd != -1);
  printf("binding dns server to %s:%d\n", t.config.dns.addr, t.config.dns.port);
  if(!udp_bind(t.dns.ev.fd, t.config.dns.addr, t.config.dns.port))
  {
    printf("failed to bind udp socket for dns at %s %d\n", t.config.dns.addr, t.config.dns.port);
    return -1;
  }
  dns_state_init(&t.dns);

  addr_mapper_init(&t.dns.addr, &t.config.tun.addr, &t.config.tun.netmask);
  
  i2p_crypto_init();
  i2cp_state_init(&t.i2cp, &i2cp_write, &t);

  i2cp_set_msghandler(&t.i2cp, SETDATE, &onsetdate, &t);
  i2cp_set_msghandler(&t.i2cp, SESSIONSTATUS, &onsessionstatus, &t);
  i2cp_set_msghandler(&t.i2cp, REQVARLS, &onreqvarls, &t);
  i2cp_set_msghandler(&t.i2cp, PAYLOAD, &onpayload, &t);
  
  struct ev_api * api;
  assert(ev_init(&t.api));
  t.running = true;
  api = &t.api;
  t.impl = api->open();
  assert(t.impl);

  api->add(t.impl, &t.dns.ev);
  
  if(t.config.tun.enabled)
  {
    printf("open tun interface %s\n", t.config.tun.ifname);
    int tunfd = api->tun(t.impl, t.config.tun);
    if(tunfd == -1)
    {
      printf("failed to open %s\n", t.config.tun.ifname);
      return 1;
    }
    t.tun.ev.ptr = &tun_handler;
    tunif_init(&t.tun, tunfd);
    api->add(t.impl,  &t.tun.ev);
  }
  else
    printf("tun interface disabled\n");
  while(t.running)
  {
    printf("generate new identity\n");
    i2p_keygen(&t.privkey);
    i2p_privkey_dest(&t.privkey, &t.ourdest);
    char * buf = (char *) t.buf;
    i2p_dest_tob32addr(&t.ourdest, buf, sizeof(t.buf));
    printf("we are %s\n", buf);
    if(t.config.i2cp.enabled)
    {
      printf("connecting to i2p router at %s port %d\n", t.config.i2cp.addr, t.config.i2cp.port);
      if(blocking_tcp_connect(t.config.i2cp.addr, t.config.i2cp.port, &t.i2cp_fd))
      {
        t.i2cp_ev.fd = t.i2cp_fd;
        t.i2cp_ev.ptr = &i2cp_handler;
        t.i2cp_ev.flags = EV_READ;
        assert(api->add(t.impl, &t.i2cp_ev));
        i2cp_begin(&t.i2cp);
        mainloop(&t);
        api->del(t.impl, t.i2cp_fd);
      }
      else
      {
        perror("blocking_tcp_connect()");
        sleep(1);
      }
    }
    else
      mainloop(&t);
  }
  api->close(t.impl);
  i2p_crypto_end();
}